

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializers.hpp
# Opt level: O0

XMLNodeAdapter * BSDFData::operator>>(XMLNodeAdapter *node,WavelengthDataBlock *wavelengthDataBlock)

{
  WavelengthDataBlock *pWVar1;
  allocator<char> local_161;
  string local_160;
  Child<std::optional<BSDFData::ScatteringDataType>_> local_140;
  allocator<char> local_111;
  string local_110;
  Child<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  allocator<char> local_c1;
  string local_c0;
  Child<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  allocator<char> local_61;
  string local_60;
  Child<std::optional<BSDFData::WavelengthDataDirection>_> local_40;
  WavelengthDataBlock *local_18;
  WavelengthDataBlock *wavelengthDataBlock_local;
  XMLNodeAdapter *node_local;
  
  local_18 = wavelengthDataBlock;
  wavelengthDataBlock_local = (WavelengthDataBlock *)node;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"WavelengthDataDirection",&local_61);
  FileParse::Child<std::optional<BSDFData::WavelengthDataDirection>_>::Child
            (&local_40,&local_60,&local_18->wavelengthDataDirection,0);
  FileParse::operator>>(node,&local_40);
  FileParse::Child<std::optional<BSDFData::WavelengthDataDirection>_>::~Child(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  pWVar1 = wavelengthDataBlock_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"ColumnAngleBasis",&local_c1);
  FileParse::
  Child<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Child(&local_a0,&local_c0,&local_18->columnAngleBasis,0);
  FileParse::operator>>((XMLNodeAdapter *)pWVar1,&local_a0);
  FileParse::
  Child<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~Child(&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  pWVar1 = wavelengthDataBlock_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"RowAngleBasis",&local_111);
  FileParse::
  Child<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Child(&local_f0,&local_110,&local_18->rowAngleBasis,0);
  FileParse::operator>>((XMLNodeAdapter *)pWVar1,&local_f0);
  FileParse::
  Child<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~Child(&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  pWVar1 = wavelengthDataBlock_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"ScatteringDataType",&local_161);
  FileParse::Child<std::optional<BSDFData::ScatteringDataType>_>::Child
            (&local_140,&local_160,&local_18->scatteringDataType,0);
  FileParse::operator>>((XMLNodeAdapter *)pWVar1,&local_140);
  FileParse::Child<std::optional<BSDFData::ScatteringDataType>_>::~Child(&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  operator>>((XMLNodeAdapter *)wavelengthDataBlock_local,&local_18->scatteringData);
  return (XMLNodeAdapter *)wavelengthDataBlock_local;
}

Assistant:

const NodeAdapter & operator>>(const NodeAdapter & node,
                                   BSDFData::WavelengthDataBlock & wavelengthDataBlock)
    {
        node >> FileParse::Child{"WavelengthDataDirection",
                                 wavelengthDataBlock.wavelengthDataDirection};
        node >> FileParse::Child{"ColumnAngleBasis", wavelengthDataBlock.columnAngleBasis};
        node >> FileParse::Child{"RowAngleBasis", wavelengthDataBlock.rowAngleBasis};
        node >> FileParse::Child{"ScatteringDataType", wavelengthDataBlock.scatteringDataType};
        // Child node name is moved down to the ScatteringData serializer since compiler cannot
        // resolve between serializer of std::vector<std::vector<double>> and Child<std::vector<T>>
        // defined in FileParse
        node >> wavelengthDataBlock.scatteringData;

        return node;
    }